

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O0

Stream * rw::xbox::writeNativeData
                   (Stream *stream,int32 len,void *object,int32 param_4,int32 param_5)

{
  long lVar1;
  long lVar2;
  int local_54;
  uint32 *puStack_50;
  int i;
  InstanceData *inst;
  uint8 *p;
  InstanceDataHeader *header;
  Geometry *geometry;
  int32 param_4_local;
  int32 param_3_local;
  void *object_local;
  int32 len_local;
  Stream *stream_local;
  
  writeChunkHeader(stream,1,len + -0xc);
  if ((*(long *)((long)object + 0x98) != 0) && (**(int **)((long)object + 0x98) == 5)) {
    Stream::writeU32(stream,5);
    lVar1 = *(long *)((long)object + 0x98);
    lVar2 = *(long *)(lVar1 + 0x38);
    *(undefined4 *)(lVar2 + 0x18) = *(undefined4 *)(lVar1 + 4);
    *(undefined2 *)(lVar2 + 0x1c) = *(undefined2 *)(lVar1 + 8);
    *(undefined2 *)(lVar2 + 0x1e) = *(undefined2 *)(lVar1 + 10);
    *(undefined4 *)(lVar2 + 0x20) = *(undefined4 *)(lVar1 + 0xc);
    *(undefined4 *)(lVar2 + 0x24) = *(undefined4 *)(lVar1 + 0x10);
    *(undefined4 *)(lVar2 + 0x28) = *(undefined4 *)(lVar1 + 0x14);
    *(undefined4 *)(lVar2 + 0x30) = *(undefined4 *)(lVar1 + 0x20);
    inst = (InstanceData *)(lVar2 + 0x3c);
    puStack_50 = *(uint32 **)(lVar1 + 0x28);
    for (local_54 = 0; local_54 < (int)(uint)*(ushort *)(lVar1 + 10); local_54 = local_54 + 1) {
      inst->minVert = *puStack_50;
      inst->numVertices = puStack_50[1];
      inst->numIndices = puStack_50[2];
      *(int *)&inst->field_0xc =
           (int)*(undefined8 *)(puStack_50 + 4) - (int)*(undefined8 *)(lVar1 + 0x38);
      inst = (InstanceData *)&inst->material;
      puStack_50 = puStack_50 + 10;
    }
    (*stream->_vptr_Stream[3])(stream,*(long *)(lVar1 + 0x38) + 0x18,(ulong)*(uint *)(lVar1 + 4));
    (*stream->_vptr_Stream[3])
              (stream,*(undefined8 *)(lVar1 + 0x18),
               (ulong)(uint)(*(int *)(lVar1 + 0x14) * *(int *)(lVar1 + 0x10)));
  }
  return stream;
}

Assistant:

Stream*
writeNativeData(Stream *stream, int32 len, void *object, int32, int32)
{
	ASSERTLITTLE;
	Geometry *geometry = (Geometry*)object;
	writeChunkHeader(stream, ID_STRUCT, len-12);
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_XBOX)
		return stream;
	stream->writeU32(PLATFORM_XBOX);
	assert(rw::version >= 0x35000 && "can't write native Xbox data < 0x35000");
	InstanceDataHeader *header = (InstanceDataHeader*)geometry->instData;

	// we just fill header->data and write that
	uint8 *p = header->data+0x18;
	*(int32*)p = header->size; p += 4;
	*(uint16*)p = header->serialNumber; p += 2;
	*(uint16*)p = header->numMeshes; p += 2;
	*(uint32*)p = header->primType; p += 4;
	*(uint32*)p = header->numVertices; p += 4;
	*(uint32*)p = header->stride; p += 4;
	// RxXboxVertexFormat in 3.3 here
	p += 4;	// skip vertexBuffer pointer
	*(bool32*)p = header->vertexAlpha; p += 4;
	p += 8; // skip begin, end pointers

	InstanceData *inst = header->begin;
	for(int i = 0; i < header->numMeshes; i++){
		*(uint32*)p = inst->minVert; p += 4;
		*(int32*)p = inst->numVertices; p += 4;
		*(int32*)p = inst->numIndices; p += 4;
		*(uint32*)p = (uint8*)inst->indexBuffer - header->data; p += 4;
		p += 8; // skip material and vertexShader
		// pixelShader in 3.3 here
		inst++;
	}

	stream->write8(header->data+0x18, header->size);
	stream->write8(header->vertexBuffer, header->stride*header->numVertices);
	return stream;
}